

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O1

vector<bool,_std::allocator<bool>_> * __thiscall
bwtil::IndexedBWT::markPositions
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,IndexedBWT *this,bool verbose
          )

{
  unsigned_long uVar1;
  vector<bool,_std::allocator<bool>_> *pvVar2;
  byte c;
  ostream *poVar3;
  ulint uVar4;
  undefined7 in_register_00000011;
  int iVar5;
  int iVar6;
  size_type __n;
  long lVar7;
  ulong uVar8;
  reference rVar9;
  allocator_type local_42;
  bool local_41;
  vector<bool,_std::allocator<bool>_> *local_40;
  int local_34;
  
  local_41 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,this->n,&local_41,&local_42);
  uVar4 = this->n;
  local_34 = (int)CONCAT71(in_register_00000011,verbose);
  local_40 = __return_storage_ptr__;
  if (local_34 != 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  uVar8 = uVar4 - 1;
  if (uVar8 == 0) {
    __n = 0;
  }
  else {
    lVar7 = 1 - uVar4;
    iVar6 = 1;
    __n = 0;
    do {
      iVar5 = (int)(((lVar7 + this->n) * 100) / this->n);
      if ((iVar6 != iVar5 & (byte)local_34 &
          ((uint)(iVar5 * -0x33333333) >> 1 | iVar5 * -0x80000000) < 0x1999999a) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"% done.\n",8);
        iVar6 = iVar5;
      }
      if (uVar8 % this->offrate == 0) {
        rVar9 = std::vector<bool,_std::allocator<bool>_>::at(local_40,__n);
        *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
      }
      c = charAt_remapped(this,__n);
      uVar1 = (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[c];
      uVar4 = rank(this,c,__n);
      __n = uVar4 + uVar1;
      uVar8 = uVar8 - 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
  }
  pvVar2 = local_40;
  rVar9 = std::vector<bool,_std::allocator<bool>_>::at(local_40,__n);
  *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
  return pvVar2;
}

Assistant:

vector<bool> markPositions(bool verbose){//mark 1 every offrate positions of the text on the bwt (vector marked_positions)

		auto marked_pos_vec = vector<bool>(n,false);

		ulint i=n-1;//current position on text
		ulint j=0;  //current position on the BWT (0=terminator position on the F column)
		uint perc;
		uint last_perc=1;

		if(verbose) cout << endl;

		while(i>0){

			perc = (100*(n-i))/n;

			if(verbose)
				if(perc%10==0 and perc!= last_perc){

					cout << "   " << perc << "% done.\n";
					last_perc=perc;

				}

			if(i%offrate==0)
				marked_pos_vec.at(j)=true;

			j = LF(j);

			i--;

		}

		//i=0
		marked_pos_vec.at(j)=true;
		//marked_positions.setBit(j,1);
		//marked_positions.computeRanks();

		return marked_pos_vec;

	}